

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

void __thiscall test_argsort::initialize_tensors(test_argsort *this,ggml_context *ctx)

{
  long lVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __last_00;
  array<long,_4UL> *paVar2;
  result_type_conflict rVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  reference pvVar7;
  int *piVar8;
  const_reference pvVar9;
  reference pvVar10;
  float *pfVar11;
  undefined8 in_RSI;
  int i_1;
  vector<float,_std::allocator<float>_> data_1;
  int64_t r;
  int i;
  vector<int,_std::allocator<int>_> data;
  ggml_tensor *t;
  default_random_engine rng;
  random_device rd;
  array<long,_4UL> *in_stack_ffffffffffffeb18;
  array<long,_4UL> *in_stack_ffffffffffffeb20;
  undefined4 in_stack_ffffffffffffeb30;
  float in_stack_ffffffffffffeb34;
  pointer in_stack_ffffffffffffeb38;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffeb40;
  random_device *in_stack_ffffffffffffeb60;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  undefined4 in_stack_ffffffffffffebd8;
  iterator in_stack_ffffffffffffebe0;
  int local_1410;
  undefined1 local_1409 [25];
  long local_13f0;
  int *local_13e8;
  int *local_13e0;
  int local_13d8;
  vector<int,_std::allocator<int>_> local_13d0;
  array<long,_4UL> *local_13b8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_1398 [625];
  undefined8 local_10;
  
  __g = local_1398;
  local_10 = in_RSI;
  std::random_device::random_device(in_stack_ffffffffffffeb60);
  rVar3 = std::random_device::operator()((random_device *)0x1608d9);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             in_stack_ffffffffffffeb20,(result_type)in_stack_ffffffffffffeb18);
  local_13b8 = (array<long,_4UL> *)ggml_get_first_tensor(local_10);
  while (local_13b8 != (array<long,_4UL> *)0x0) {
    if (*(int *)&(((_Vector_base<float,_std::allocator<float>_> *)local_13b8->_M_elems)->_M_impl).
                 super__Vector_impl_data._M_start == 0x1a) {
      ggml_nelements(local_13b8);
      std::allocator<int>::allocator((allocator<int> *)0x16096f);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeb40,
                 (size_type)in_stack_ffffffffffffeb38,
                 (allocator_type *)CONCAT44(in_stack_ffffffffffffeb34,in_stack_ffffffffffffeb30));
      std::allocator<int>::~allocator((allocator<int> *)0x16099b);
      for (local_13d8 = 0; lVar5 = (long)local_13d8, lVar6 = ggml_nelements(local_13b8),
          lVar5 < lVar6; local_13d8 = local_13d8 + 1) {
        iVar4 = rand();
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&local_13d0,(long)local_13d8);
        *pvVar7 = iVar4;
      }
      local_13e0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeb18)
      ;
      local_13e8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffeb18)
      ;
      __last._M_current._4_4_ = rVar3;
      __last._M_current._0_4_ = in_stack_ffffffffffffebd8;
      std::
      shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 in_stack_ffffffffffffebe0._M_current,__last,__g);
      paVar2 = local_13b8;
      piVar8 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x160aed);
      pvVar9 = std::array<long,_4UL>::operator[]
                         (in_stack_ffffffffffffeb20,(size_type)in_stack_ffffffffffffeb18);
      lVar5 = *pvVar9;
      pvVar9 = std::array<long,_4UL>::operator[]
                         (in_stack_ffffffffffffeb20,(size_type)in_stack_ffffffffffffeb18);
      lVar6 = *pvVar9;
      pvVar9 = std::array<long,_4UL>::operator[]
                         (in_stack_ffffffffffffeb20,(size_type)in_stack_ffffffffffffeb18);
      lVar1 = *pvVar9;
      pvVar9 = std::array<long,_4UL>::operator[]
                         (in_stack_ffffffffffffeb20,(size_type)in_stack_ffffffffffffeb18);
      ggml_backend_tensor_set(paVar2,piVar8,0,lVar5 * lVar6 * lVar1 * *pvVar9 * 4);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffeb34,in_stack_ffffffffffffeb30));
    }
    else if (*(int *)&(((_Vector_base<float,_std::allocator<float>_> *)local_13b8->_M_elems)->
                      _M_impl).super__Vector_impl_data._M_start == 0) {
      for (local_13f0 = 0; lVar5 = local_13f0, lVar6 = ggml_nrows(local_13b8), lVar5 < lVar6;
          local_13f0 = local_13f0 + 1) {
        in_stack_ffffffffffffeb38 =
             (((_Vector_base<float,_std::allocator<float>_> *)local_13b8->_M_elems)->_M_impl).
             super__Vector_impl_data._M_end_of_storage;
        in_stack_ffffffffffffeb40 = (vector<float,_std::allocator<float>_> *)local_1409;
        std::allocator<float>::allocator((allocator<float> *)0x160c1a);
        std::vector<float,_std::allocator<float>_>::vector
                  (in_stack_ffffffffffffeb40,(size_type)in_stack_ffffffffffffeb38,
                   (allocator_type *)CONCAT44(in_stack_ffffffffffffeb34,in_stack_ffffffffffffeb30));
        std::allocator<float>::~allocator((allocator<float> *)0x160c40);
        for (local_1410 = 0;
            (long)local_1410 <
            (long)(((_Vector_base<float,_std::allocator<float>_> *)local_13b8->_M_elems)->_M_impl).
                  super__Vector_impl_data._M_end_of_storage; local_1410 = local_1410 + 1) {
          in_stack_ffffffffffffeb34 = (float)local_1410;
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                              ((vector<float,_std::allocator<float>_> *)(local_1409 + 1),
                               (long)local_1410);
          *pvVar10 = in_stack_ffffffffffffeb34;
        }
        std::vector<float,_std::allocator<float>_>::begin
                  ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffeb18);
        in_stack_ffffffffffffebe0 =
             std::vector<float,_std::allocator<float>_>::end
                       ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffeb18);
        __last_00._M_current._4_4_ = rVar3;
        __last_00._M_current._0_4_ = in_stack_ffffffffffffebd8;
        std::
        shuffle<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                   in_stack_ffffffffffffebe0._M_current,__last_00,__g);
        in_stack_ffffffffffffeb20 = local_13b8;
        pfVar11 = std::vector<float,_std::allocator<float>_>::data
                            ((vector<float,_std::allocator<float>_> *)0x160d2d);
        ggml_backend_tensor_set
                  (in_stack_ffffffffffffeb20,pfVar11,
                   local_13f0 * *(long *)((long)(local_13b8 + 1) + 0x18),
                   (long)(((_Vector_base<float,_std::allocator<float>_> *)local_13b8->_M_elems)->
                         _M_impl).super__Vector_impl_data._M_end_of_storage << 2);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_ffffffffffffeb34,in_stack_ffffffffffffeb30));
      }
    }
    else {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-backend-ops.cpp"
                 ,0xb30,"fatal error");
    }
    in_stack_ffffffffffffeb18 = (array<long,_4UL> *)ggml_get_next_tensor(local_10,local_13b8);
    local_13b8 = in_stack_ffffffffffffeb18;
  }
  std::random_device::~random_device((random_device *)0x160e00);
  return;
}

Assistant:

void initialize_tensors(ggml_context * ctx) override {
        std::random_device rd;
        std::default_random_engine rng(rd());
        for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
            if (t->type == GGML_TYPE_I32) {
                // indices
                std::vector<int> data(ggml_nelements(t));
                for (int i = 0; i < ggml_nelements(t); i++) {
                    data[i] = rand();
                }
                std::shuffle(data.begin(), data.end(), rng);
                ggml_backend_tensor_set(t, data.data(), 0, ne[0]*ne[1]*ne[2]*ne[3] * sizeof(int));
            } else if (t->type == GGML_TYPE_F32) {
                // initialize with unique values to avoid ties
                for (int64_t r = 0; r < ggml_nrows(t); r++) {
                    std::vector<float> data(t->ne[0]);
                    for (int i = 0; i < t->ne[0]; i++) {
                        data[i] = i;
                    }
                    std::shuffle(data.begin(), data.end(), rng);
                    ggml_backend_tensor_set(t, data.data(), r * t->nb[1], t->ne[0] * sizeof(float));
                }
            } else {
                GGML_ABORT("fatal error");
            }
        }
    }